

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_cwriter_create(Curl_cwriter **pwriter,Curl_easy *data,Curl_cwtype *cwt,
                            Curl_cwriter_phase phase)

{
  Curl_cwriter *pCVar1;
  Curl_cwriter *local_48;
  void *p;
  Curl_cwriter *pCStack_30;
  CURLcode result;
  Curl_cwriter *writer;
  Curl_cwriter_phase phase_local;
  Curl_cwtype *cwt_local;
  Curl_easy *data_local;
  Curl_cwriter **pwriter_local;
  
  pCStack_30 = (Curl_cwriter *)0x0;
  p._4_4_ = CURLE_OUT_OF_MEMORY;
  pCVar1 = (Curl_cwriter *)(*Curl_ccalloc)(1,cwt->cwriter_size);
  if (pCVar1 != (Curl_cwriter *)0x0) {
    pCVar1->cwt = cwt;
    pCVar1->ctx = pCVar1;
    pCVar1->phase = phase;
    p._4_4_ = (*cwt->do_init)(data,pCVar1);
    pCStack_30 = pCVar1;
  }
  if (p._4_4_ == CURLE_OK) {
    local_48 = pCStack_30;
  }
  else {
    local_48 = (Curl_cwriter *)0x0;
  }
  *pwriter = local_48;
  if (p._4_4_ != CURLE_OK) {
    (*Curl_cfree)(pCStack_30);
  }
  return p._4_4_;
}

Assistant:

CURLcode Curl_cwriter_create(struct Curl_cwriter **pwriter,
                                   struct Curl_easy *data,
                                   const struct Curl_cwtype *cwt,
                                   Curl_cwriter_phase phase)
{
  struct Curl_cwriter *writer = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  void *p;

  DEBUGASSERT(cwt->cwriter_size >= sizeof(struct Curl_cwriter));
  p = calloc(1, cwt->cwriter_size);
  if(!p)
    goto out;

  writer = (struct Curl_cwriter *)p;
  writer->cwt = cwt;
  writer->ctx = p;
  writer->phase = phase;
  result = cwt->do_init(data, writer);

out:
  *pwriter = result? NULL : writer;
  if(result)
    free(writer);
  return result;
}